

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RepeatLoopFixedInst::Exec
          (RepeatLoopFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  Label LVar4;
  Program *pPVar5;
  long lVar6;
  LoopInfo *pLVar7;
  PageAllocation *pPVar8;
  size_t sVar9;
  code *pcVar10;
  bool bVar11;
  uint uVar12;
  undefined4 *puVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  
  uVar15 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  if ((ulong)(((matcher->program).ptr)->rep).insts.instsLen < uVar15 + 0x17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                        "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar11) goto LAB_00f0ce5c;
    *puVar13 = 0;
  }
  if ((((matcher->program).ptr)->rep).insts.insts.ptr[uVar15] != 'J') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                        "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar11) goto LAB_00f0ce5c;
    *puVar13 = 0;
  }
  pPVar5 = (matcher->program).ptr;
  lVar6 = *(long *)&pPVar5->rep;
  iVar2 = *(int *)(lVar6 + 1 + uVar15);
  lVar16 = (long)iVar2;
  if ((lVar16 < 0) || (pPVar5->numLoops <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                        "loopId >= 0 && loopId < program->numLoops");
    if (!bVar11) goto LAB_00f0ce5c;
    *puVar13 = 0;
  }
  pLVar7 = (matcher->loopInfos).ptr;
  uVar12 = pLVar7[lVar16].number + 1;
  pLVar7[lVar16].number = uVar12;
  uVar17 = *(uint *)(lVar6 + 5 + uVar15);
  if (uVar12 < uVar17) {
    uVar17 = (this->super_RepeatLoopMixin).beginLabel + 0x17;
  }
  else {
    uVar3 = *(uint *)(lVar6 + 9 + uVar15);
    if ((uVar3 == 0xffffffff) || (uVar12 < uVar3)) {
      if (uVar12 == uVar17) {
        if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize -
            (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop < 0x20) {
          ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
        }
        if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                              ,199,"(bufferSize)","bufferSize");
          if (!bVar11) goto LAB_00f0ce5c;
          *puVar13 = 0;
        }
        pPVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.pageAllocation;
        sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.nextTop;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop = sVar9 + 0x20;
        *(size_t *)((long)&pPVar8[1].pageCount + sVar9) =
             (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             topElementSize;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        topElementSize = 0x20;
        LVar4 = (this->super_RepeatLoopMixin).beginLabel;
        *(undefined1 *)((long)&pPVar8[2].pageCount + sVar9) = 7;
        *(undefined ***)((long)&pPVar8[1].segment + sVar9) = &PTR_Print_015598a8;
        *(Label *)((long)&pPVar8[2].pageCount + sVar9 + 4) = LVar4;
        *(undefined1 *)((long)&pPVar8[2].segment + sVar9) = 1;
        Matcher::PushStats(matcher,contStack,input);
      }
      uVar17 = (this->super_RepeatLoopMixin).beginLabel + 0x17;
    }
    else {
      if (uVar17 < uVar3) {
        pcVar14 = ContinuousPageStack<1UL>::Top
                            ((ContinuousPageStack<1UL> *)contStack,
                             (contStack->
                             super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                             topElementSize);
        pcVar1 = pcVar14 + 8;
        if (pcVar14 == (char *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                              ,0xd20,"(top != 0)","top != 0");
          if (!bVar11) goto LAB_00f0ce5c;
          *puVar13 = 0;
          pcVar1 = (char *)0x0;
        }
        if (pcVar1[8] != '\a') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                              ,0xd21,"(top->tag == Cont::ContTag::RewindLoopFixed)",
                              "top->tag == Cont::ContTag::RewindLoopFixed");
          if (!bVar11) goto LAB_00f0ce5c;
          *puVar13 = 0;
        }
        pcVar1[0x10] = '\0';
      }
      uVar17 = *(uint *)(lVar6 + 0xf + uVar15);
    }
  }
  if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x76d,"(label < program->rep.insts.instsLen)",
                        "label < program->rep.insts.instsLen");
    if (!bVar11) {
LAB_00f0ce5c:
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar13 = 0;
  }
  *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar17;
  return false;
}

Assistant:

inline bool RepeatLoopFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedInst* begin = matcher.L2I(BeginLoopFixed, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixed);
                RewindLoopFixedCont* rewind = (RewindLoopFixedCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        return false;
    }